

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase480::run(TestCase480 *this)

{
  int iVar1;
  char (*in_RDX) [4];
  char (*extraout_RDX) [4];
  char (*extraout_RDX_00) [4];
  char (*params) [4];
  Maybe<kj::String> *maybe;
  bool wasNull;
  DebugComparison<int,_int> _kjCondition;
  Array<char> local_c8;
  anon_class_8_1_c65f9af0 func;
  NullableValue<kj::String> local_a8;
  NullableValue<kj::String> local_88;
  NullableValue<kj::String> local_68;
  NullableValue<kj::String> local_48;
  
  maybe = (Maybe<kj::String> *)0x1bb0bf;
  str<char_const(&)[4]>((String *)&local_c8,(kj *)0x1bb0bf,in_RDX);
  local_48.isSet = true;
  local_48.field_1.value.content.ptr = local_c8.ptr;
  local_48.field_1.value.content.size_ = local_c8.size_;
  local_48.field_1.value.content.disposer = local_c8.disposer;
  local_c8.ptr = (char *)0x0;
  local_c8.size_ = 0;
  iVar1 = run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_48,maybe);
  _kjCondition.result = iVar1 == 0x7b;
  _kjCondition.right = 0x7b;
  _kjCondition.left = iVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _::NullableValue<kj::String>::~NullableValue(&local_48);
  Array<char>::~Array(&local_c8);
  if ((iVar1 != 0x7b) && (_::Debug::minSeverity < 3)) {
    maybe = (Maybe<kj::String> *)0x1f2;
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&_kjCondition);
  }
  local_68.isSet = false;
  iVar1 = run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_68,maybe);
  _kjCondition.result = iVar1 == -1;
  _kjCondition.right = -1;
  _kjCondition.left = iVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _::NullableValue<kj::String>::~NullableValue(&local_68);
  params = extraout_RDX;
  if ((iVar1 != -1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,499,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
               (char (*) [38])"failed: expected func(kj::none) == -1",&_kjCondition);
    params = extraout_RDX_00;
  }
  wasNull = false;
  func.wasNull = &wasNull;
  str<char_const(&)[4]>((String *)&local_c8,(kj *)0x1bb0bf,params);
  local_88.isSet = true;
  local_88.field_1.value.content.ptr = local_c8.ptr;
  local_88.field_1.value.content.size_ = local_c8.size_;
  local_88.field_1.value.content.disposer = local_c8.disposer;
  local_c8.ptr = (char *)0x0;
  local_c8.size_ = 0;
  iVar1 = run::anon_class_8_1_c65f9af0::operator()(&func,(Maybe<kj::String> *)&local_88);
  _kjCondition.right = 0x7b;
  _kjCondition.left = iVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = iVar1 == 0x7b;
  _::NullableValue<kj::String>::~NullableValue(&local_88);
  Array<char>::~Array(&local_c8);
  if (_::Debug::minSeverity < 3 && iVar1 != 0x7b) {
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x220,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&_kjCondition);
  }
  _kjCondition._0_8_ = CONCAT71(_kjCondition._1_7_,wasNull) ^ 1;
  if ((wasNull != false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x221,ERROR,"\"failed: expected \" \"!wasNull\", _kjCondition",
               (char (*) [26])"failed: expected !wasNull",(DebugExpression<bool> *)&_kjCondition);
  }
  local_a8.isSet = false;
  iVar1 = run::anon_class_8_1_c65f9af0::operator()(&func,(Maybe<kj::String> *)&local_a8);
  _kjCondition.right = -1;
  _kjCondition.left = iVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = iVar1 == -1;
  _::NullableValue<kj::String>::~NullableValue(&local_a8);
  if (_::Debug::minSeverity < 3 && iVar1 != -1) {
    _::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x222,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
               (char (*) [38])"failed: expected func(kj::none) == -1",&_kjCondition);
  }
  if ((wasNull == false) && (_::Debug::minSeverity < 3)) {
    _kjCondition._0_8_ = &wasNull;
    _::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x223,ERROR,"\"failed: expected \" \"wasNull\", _kjCondition",
               (char (*) [25])"failed: expected wasNull",(DebugExpression<bool_&> *)&_kjCondition);
  }
  return;
}

Assistant:

TEST(Common, MaybeUnwrapOrReturn) {
  {
    auto func = [](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR_RETURN(i, -1);
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(func(kj::none) == -1);
  }

  {
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR_RETURN(kj::mv(maybe), -1);
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(func(kj::none) == -1);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR_RETURN(i);
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

  // Test KJ_UNWRAP_OR
  {
    bool wasNull = false;
    auto func = [&](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR(i, {
        wasNull = true;
        return -1;
      });
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  {
    bool wasNull = false;
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR(kj::mv(maybe), {
        wasNull = true;
        return -1;
      });
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR(i, {
        return;
      });
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

}